

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O0

void __thiscall CLIntercept::checkTimingEvents(CLIntercept *this)

{
  bool bVar1;
  uint uVar2;
  cl_icd_dispatch *pcVar3;
  unsigned_long *puVar4;
  ostream *poVar5;
  SConfig *pSVar6;
  CLIntercept *in_RDI;
  float __x;
  double dVar7;
  bool useProfilingDelta;
  ostringstream ss_1;
  ostringstream ss;
  cl_ulong submitDelta;
  cl_ulong queuedDelta;
  SDeviceTimingStats *deviceTimingStats;
  cl_ulong delta;
  cl_ulong commandEnd;
  cl_ulong commandStart;
  cl_ulong commandSubmit;
  cl_ulong commandQueued;
  SEventListNode *node;
  cl_int eventStatus;
  cl_int errorCode;
  iterator next;
  iterator current;
  lock_guard<std::mutex> lock;
  key_type *in_stack_fffffffffffffa48;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
  *in_stack_fffffffffffffa50;
  const_iterator in_stack_fffffffffffffa58;
  cl_icd_dispatch *in_stack_fffffffffffffa88;
  SConfig *in_stack_fffffffffffffa90;
  byte local_559;
  ostream *in_stack_fffffffffffffad0;
  ostream *in_stack_fffffffffffffad8;
  ostream *in_stack_fffffffffffffae0;
  ostream *in_stack_fffffffffffffae8;
  ostream *in_stack_fffffffffffffaf0;
  CLIntercept *in_stack_fffffffffffffaf8;
  time_point in_stack_fffffffffffffb00;
  ostream *in_stack_fffffffffffffb18;
  ostream *in_stack_fffffffffffffb20;
  ostream *in_stack_fffffffffffffb28;
  CLIntercept *in_stack_fffffffffffffb30;
  _List_const_iterator<CLIntercept::SEventListNode> local_3f8;
  _List_node_base *local_3f0;
  _List_const_iterator<CLIntercept::SEventListNode> local_3e8;
  key_type *local_3e0;
  byte local_3d1;
  string local_3d0 [32];
  ostringstream local_3b0 [376];
  string local_238 [32];
  ostringstream local_218 [376];
  ulong local_a0;
  ulong local_98;
  mapped_type *local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  _List_node_base *local_70;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
  *local_68 [3];
  reference local_50;
  int local_48;
  uint local_44;
  _Self local_40;
  _List_iterator<CLIntercept::SEventListNode> local_38;
  _Self local_30 [3];
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_fffffffffffffa50,
             (mutex_type *)in_stack_fffffffffffffa48);
  local_30[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>
       ::begin((list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_> *)
               in_stack_fffffffffffffa48);
  std::_List_iterator<CLIntercept::SEventListNode>::_List_iterator(&local_38);
  while( true ) {
    local_40._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>::end
                   ((list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>
                     *)in_stack_fffffffffffffa48);
    bVar1 = std::operator!=(local_30,&local_40);
    if (!bVar1) break;
    local_44 = 0;
    local_48 = 0;
    local_38._M_node = local_30[0]._M_node;
    std::_List_iterator<CLIntercept::SEventListNode>::operator++(&local_38);
    local_50 = std::_List_iterator<CLIntercept::SEventListNode>::operator*
                         ((_List_iterator<CLIntercept::SEventListNode> *)0x207358);
    pcVar3 = dispatch(in_RDI);
    local_44 = (*pcVar3->clGetEventInfo)(local_50->Event,0x11d3,4,&local_48,(size_t *)0x0);
    if (local_44 == 0xffffffc6) {
      __x = (float)std::__cxx11::string::c_str();
      logf(in_RDI,__x);
      std::_List_const_iterator<CLIntercept::SEventListNode>::_List_const_iterator
                (&local_3f8,local_30);
      std::__cxx11::list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>
      ::erase((list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_> *)
              in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
    }
    else if ((local_44 == 0) && (local_48 == 0)) {
      pSVar6 = config(in_RDI);
      if (((pSVar6->DevicePerformanceTiming & 1U) != 0) ||
         ((pSVar6 = config(in_RDI), (pSVar6->ITTPerformanceTiming & 1U) != 0 ||
          (pSVar6 = config(in_RDI), (pSVar6->ChromePerformanceTiming & 1U) != 0)))) {
        local_68[0] = (unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
                       *)0x0;
        local_70 = (_List_node_base *)0x0;
        local_78 = 0;
        local_80 = 0;
        pcVar3 = dispatch(in_RDI);
        uVar2 = (*pcVar3->clGetEventProfilingInfo)(local_50->Event,0x1280,8,local_68,(size_t *)0x0);
        local_44 = local_44 | uVar2;
        pcVar3 = dispatch(in_RDI);
        uVar2 = (*pcVar3->clGetEventProfilingInfo)(local_50->Event,0x1281,8,&local_70,(size_t *)0x0)
        ;
        local_44 = local_44 | uVar2;
        pcVar3 = dispatch(in_RDI);
        uVar2 = (*pcVar3->clGetEventProfilingInfo)(local_50->Event,0x1282,8,&local_78,(size_t *)0x0)
        ;
        local_44 = local_44 | uVar2;
        pcVar3 = dispatch(in_RDI);
        uVar2 = (*pcVar3->clGetEventProfilingInfo)(local_50->Event,0x1283,8,&local_80,(size_t *)0x0)
        ;
        local_44 = uVar2 | local_44;
        if (local_44 == 0) {
          local_88 = local_80 - local_78;
          std::
          map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
          ::operator[]((map<_cl_device_id_*,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>,_std::less<_cl_device_id_*>,_std::allocator<std::pair<_cl_device_id_*const,_std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>_>_>_>
                        *)in_stack_fffffffffffffa90,(key_type *)in_stack_fffffffffffffa88);
          local_90 = std::
                     unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLIntercept::SDeviceTimingStats>_>_>
                     ::operator[](in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
          local_90->NumberOfCalls = local_90->NumberOfCalls + 1;
          local_90->TotalNS = local_90->TotalNS + local_88;
          puVar4 = std::min<unsigned_long>(&local_90->MinNS,&local_88);
          local_90->MinNS = *puVar4;
          puVar4 = std::max<unsigned_long>(&local_90->MaxNS,&local_88);
          local_90->MaxNS = *puVar4;
          pSVar6 = config(in_RDI);
          if ((pSVar6->DevicePerformanceTimeLogging & 1U) != 0) {
            local_98 = (long)local_70 - (long)local_68[0];
            local_a0 = local_78 - (long)local_70;
            std::__cxx11::ostringstream::ostringstream(local_218);
            poVar5 = std::operator<<((ostream *)local_218,"Device Time for ");
            poVar5 = std::operator<<(poVar5,(string *)&local_50->Name);
            poVar5 = std::operator<<(poVar5," (enqueue ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_50->EnqueueCounter);
            poVar5 = std::operator<<(poVar5,") = ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_98);
            in_stack_fffffffffffffb30 =
                 (CLIntercept *)std::operator<<(poVar5," ns (queued -> submit), ");
            in_stack_fffffffffffffb28 =
                 (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb30,local_a0);
            in_stack_fffffffffffffb20 =
                 std::operator<<(in_stack_fffffffffffffb28," ns (submit -> start), ");
            in_stack_fffffffffffffb18 =
                 (ostream *)std::ostream::operator<<(in_stack_fffffffffffffb20,local_88);
            std::operator<<(in_stack_fffffffffffffb18," ns (start -> end)\n");
            dVar7 = (double)std::__cxx11::ostringstream::str();
            log(in_RDI,dVar7);
            std::__cxx11::string::~string(local_238);
            std::__cxx11::ostringstream::~ostringstream(local_218);
          }
          pSVar6 = config(in_RDI);
          if ((pSVar6->DevicePerformanceTimelineLogging & 1U) != 0) {
            std::__cxx11::ostringstream::ostringstream(local_3b0);
            poVar5 = std::operator<<((ostream *)local_3b0,"Device Timeline for ");
            in_stack_fffffffffffffb00.__d.__r =
                 (duration)std::operator<<(poVar5,(string *)&local_50->Name);
            in_stack_fffffffffffffaf8 =
                 (CLIntercept *)
                 std::operator<<((ostream *)in_stack_fffffffffffffb00.__d.__r," (enqueue ");
            in_stack_fffffffffffffaf0 =
                 (ostream *)
                 std::ostream::operator<<(in_stack_fffffffffffffaf8,local_50->EnqueueCounter);
            in_stack_fffffffffffffae8 = std::operator<<(in_stack_fffffffffffffaf0,") = ");
            in_stack_fffffffffffffae0 =
                 (ostream *)std::ostream::operator<<(in_stack_fffffffffffffae8,(ulong)local_68[0]);
            in_stack_fffffffffffffad8 = std::operator<<(in_stack_fffffffffffffae0," ns (queued), ");
            in_stack_fffffffffffffad0 =
                 (ostream *)std::ostream::operator<<(in_stack_fffffffffffffad8,(ulong)local_70);
            poVar5 = std::operator<<(in_stack_fffffffffffffad0," ns (submit), ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_78);
            poVar5 = std::operator<<(poVar5," ns (start), ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_80);
            std::operator<<(poVar5," ns (end)\n");
            dVar7 = (double)std::__cxx11::ostringstream::str();
            log(in_RDI,dVar7);
            std::__cxx11::string::~string(local_3d0);
            std::__cxx11::ostringstream::~ostringstream(local_3b0);
          }
          pSVar6 = config(in_RDI);
          if ((pSVar6->ChromePerformanceTiming & 1U) != 0) {
            local_559 = 0;
            if ((local_50->UseProfilingDelta & 1U) != 0) {
              pSVar6 = config(in_RDI);
              local_559 = pSVar6->ChromePerformanceTimingEstimateQueuedTime ^ 0xff;
            }
            local_3d1 = local_559 & 1;
            in_stack_fffffffffffffa48 = (key_type *)(local_50->QueuedTime).__d.__r;
            in_stack_fffffffffffffa50 = local_68[0];
            in_stack_fffffffffffffa58._M_node = local_70;
            local_3e0 = in_stack_fffffffffffffa48;
            chromeTraceEvent(in_stack_fffffffffffffaf8,(string *)in_stack_fffffffffffffaf0,
                             SUB81((ulong)in_stack_fffffffffffffae8 >> 0x38,0),
                             (int64_t)in_stack_fffffffffffffae0,(uint64_t)in_stack_fffffffffffffad8,
                             (uint)((ulong)in_stack_fffffffffffffad0 >> 0x20),
                             in_stack_fffffffffffffb00,(cl_ulong)in_stack_fffffffffffffb18,
                             (cl_ulong)in_stack_fffffffffffffb20,(cl_ulong)in_stack_fffffffffffffb28
                             ,(cl_ulong)in_stack_fffffffffffffb30);
          }
        }
      }
      in_stack_fffffffffffffa90 = config(in_RDI);
      if ((in_stack_fffffffffffffa90->DevicePerfCounterEventBasedSampling & 1U) != 0) {
        getMDAPICountersFromEvent
                  (in_stack_fffffffffffffb30,(string *)in_stack_fffffffffffffb28,
                   (cl_event)in_stack_fffffffffffffb20);
      }
      in_stack_fffffffffffffa88 = dispatch(in_RDI);
      (*in_stack_fffffffffffffa88->clReleaseEvent)(local_50->Event);
      std::_List_const_iterator<CLIntercept::SEventListNode>::_List_const_iterator
                (&local_3e8,local_30);
      local_3f0 = (_List_node_base *)
                  std::__cxx11::
                  list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>::
                  erase((list<CLIntercept::SEventListNode,_std::allocator<CLIntercept::SEventListNode>_>
                         *)in_stack_fffffffffffffa50,in_stack_fffffffffffffa58);
    }
    local_30[0]._M_node = local_38._M_node;
  }
  pSVar6 = config(in_RDI);
  if ((pSVar6->DevicePerfCounterTimeBasedSampling & 1U) != 0) {
    getMDAPICountersFromStream((CLIntercept *)in_stack_fffffffffffffb00.__d.__r);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x207e8e);
  return;
}

Assistant:

void CLIntercept::checkTimingEvents()
{
    std::lock_guard<std::mutex> lock(m_Mutex);

    CEventList::iterator    current = m_EventList.begin();
    CEventList::iterator    next;

    while( current != m_EventList.end() )
    {
        cl_int  errorCode = CL_SUCCESS;
        cl_int  eventStatus = 0;

        next = current;
        ++next;

        const SEventListNode& node = *current;

        errorCode = dispatch().clGetEventInfo(
            node.Event,
            CL_EVENT_COMMAND_EXECUTION_STATUS,
            sizeof( eventStatus ),
            &eventStatus,
            NULL );

        switch( errorCode )
        {
        case CL_SUCCESS:
            if( eventStatus == CL_COMPLETE )
            {
                if( config().DevicePerformanceTiming ||
                    config().ITTPerformanceTiming ||
                    config().ChromePerformanceTiming )
                {
                    cl_ulong    commandQueued = 0;
                    cl_ulong    commandSubmit = 0;
                    cl_ulong    commandStart = 0;
                    cl_ulong    commandEnd = 0;

                    errorCode |= dispatch().clGetEventProfilingInfo(
                        node.Event,
                        CL_PROFILING_COMMAND_QUEUED,
                        sizeof( commandQueued ),
                        &commandQueued,
                        NULL );
                    errorCode |= dispatch().clGetEventProfilingInfo(
                        node.Event,
                        CL_PROFILING_COMMAND_SUBMIT,
                        sizeof( commandSubmit ),
                        &commandSubmit,
                        NULL );
                    errorCode |= dispatch().clGetEventProfilingInfo(
                        node.Event,
                        CL_PROFILING_COMMAND_START,
                        sizeof( commandStart ),
                        &commandStart,
                        NULL );
                    errorCode |= dispatch().clGetEventProfilingInfo(
                        node.Event,
                        CL_PROFILING_COMMAND_END,
                        sizeof( commandEnd ),
                        &commandEnd,
                        NULL );
                    if( errorCode == CL_SUCCESS )
                    {
                        cl_ulong delta = commandEnd - commandStart;

                        SDeviceTimingStats& deviceTimingStats = m_DeviceTimingStatsMap[node.Device][node.Name];

                        deviceTimingStats.NumberOfCalls++;
                        deviceTimingStats.TotalNS += delta;
                        deviceTimingStats.MinNS = std::min< cl_ulong >( deviceTimingStats.MinNS, delta );
                        deviceTimingStats.MaxNS = std::max< cl_ulong >( deviceTimingStats.MaxNS, delta );

                        //uint64_t    numberOfCalls = deviceTimingStats.NumberOfCalls;

                        if( config().DevicePerformanceTimeLogging )
                        {
                            cl_ulong    queuedDelta = commandSubmit - commandQueued;
                            cl_ulong    submitDelta = commandStart - commandSubmit;

                            std::ostringstream  ss;

                            ss << "Device Time for "
                                //<< "call " << numberOfCalls << " to "
                                << node.Name << " (enqueue " << node.EnqueueCounter << ") = "
                                << queuedDelta << " ns (queued -> submit), "
                                << submitDelta << " ns (submit -> start), "
                                << delta << " ns (start -> end)\n";

                            log( ss.str() );
                        }

                        if( config().DevicePerformanceTimelineLogging )
                        {
                            std::ostringstream  ss;

                            ss << "Device Timeline for "
                                //<< "call " << numberOfCalls << " to "
                                << node.Name << " (enqueue " << node.EnqueueCounter << ") = "
                                << commandQueued << " ns (queued), "
                                << commandSubmit << " ns (submit), "
                                << commandStart << " ns (start), "
                                << commandEnd << " ns (end)\n";

                            log( ss.str() );
                        }

#if defined(USE_ITT)
                        if( config().ITTPerformanceTiming )
                        {
                            ittTraceEvent(
                                node.Name,
                                node.Event,
                                node.QueuedTime,
                                commandQueued,
                                commandSubmit,
                                commandStart,
                                commandEnd );
                        }
#endif

                        if( config().ChromePerformanceTiming )
                        {
                            bool useProfilingDelta =
                                node.UseProfilingDelta &&
                                !config().ChromePerformanceTimingEstimateQueuedTime;

                            chromeTraceEvent(
                                node.Name,
                                useProfilingDelta,
                                node.ProfilingDeltaNS,
                                node.EnqueueCounter,
                                node.QueueNumber,
                                node.QueuedTime,
                                commandQueued,
                                commandSubmit,
                                commandStart,
                                commandEnd );
                        }
                    }
                }

#if defined(USE_MDAPI)
                if( config().DevicePerfCounterEventBasedSampling )
                {
                    getMDAPICountersFromEvent(
                        node.Name,
                        node.Event );
                }
#endif

                dispatch().clReleaseEvent( node.Event );

                m_EventList.erase( current );
            }
            break;
        case CL_INVALID_EVENT:
            {
                // This is unexpected.  We retained the event when we
                // added it to the list.  Remove the event from the
                // list.
                logf( "Unexpectedly got CL_INVALID_EVENT for an event from %s!\n",
                    node.Name.c_str() );

                m_EventList.erase( current );
            }
            break;
        default:
            // nothing
            break;
        }

        current = next;
    }

#if defined(USE_MDAPI)
    if( config().DevicePerfCounterTimeBasedSampling )
    {
        getMDAPICountersFromStream();
    }
#endif
}